

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubidi_props.cpp
# Opt level: O2

int32_t ubidi_getMaxValue_63(UProperty which)

{
  int32_t iVar1;
  
  if (which == UCHAR_BIDI_CLASS) {
    iVar1 = 0x16;
  }
  else if (which == UCHAR_BIDI_PAIRED_BRACKET_TYPE) {
    iVar1 = 2;
  }
  else if (which == UCHAR_JOINING_TYPE) {
    iVar1 = 5;
  }
  else if (which == UCHAR_JOINING_GROUP) {
    iVar1 = 0x65;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

U_CFUNC int32_t
ubidi_getMaxValue(UProperty which) {
    int32_t max=ubidi_props_singleton.indexes[UBIDI_MAX_VALUES_INDEX];
    switch(which) {
    case UCHAR_BIDI_CLASS:
        return (max&UBIDI_CLASS_MASK);
    case UCHAR_JOINING_GROUP:
        return (max&UBIDI_MAX_JG_MASK)>>UBIDI_MAX_JG_SHIFT;
    case UCHAR_JOINING_TYPE:
        return (max&UBIDI_JT_MASK)>>UBIDI_JT_SHIFT;
    case UCHAR_BIDI_PAIRED_BRACKET_TYPE:
        return (max&UBIDI_BPT_MASK)>>UBIDI_BPT_SHIFT;
    default:
        return -1; /* undefined */
    }
}